

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

int __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
::ReadUInt(NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
           *this,uint ub)

{
  uint uVar1;
  ulong local_38 [2];
  ArgList local_28;
  
  uVar1 = BinaryReader<mp::internal::IdentityConverter>::ReadUInt(this->reader_);
  if (ub <= uVar1) {
    local_38[0] = (ulong)uVar1;
    local_28.types_ = 2;
    local_28.field_1.values_ = (Value *)local_38;
    BinaryReaderBase::ReportError
              (&this->reader_->super_BinaryReaderBase,(CStringRef)0x139ebc,&local_28);
  }
  return uVar1;
}

Assistant:

int ReadUInt(unsigned ub) {
    int value = reader_.ReadUInt();
    unsigned unsigned_value = value;
    if (unsigned_value >= ub)
      reader_.ReportError("integer {} out of bounds", value);
    return value;
  }